

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLStringTokenizer.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::XMLStringTokenizer::nextToken(XMLStringTokenizer *this)

{
  BaseRefVectorOf<char16_t> *this_00;
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  XMLCh *targetStr;
  ulong endIndex;
  ulong startIndex;
  undefined4 extraout_var;
  
  endIndex = this->fOffset;
  if (endIndex < this->fStringLen) {
    bVar2 = false;
    startIndex = endIndex;
    do {
      iVar3 = XMLString::indexOf(this->fDelimeters,this->fString[endIndex]);
      if (iVar3 == -1) {
        bVar2 = true;
      }
      else {
        if (bVar2) break;
        startIndex = startIndex + 1;
      }
      endIndex = endIndex + 1;
    } while (endIndex < this->fStringLen);
    this->fOffset = endIndex;
    if (bVar2) {
      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,(endIndex - startIndex) * 2 + 2);
      targetStr = (XMLCh *)CONCAT44(extraout_var,iVar3);
      XMLString::subString(targetStr,this->fString,startIndex,endIndex,this->fMemoryManager);
      this_00 = &this->fTokens->super_BaseRefVectorOf<char16_t>;
      BaseRefVectorOf<char16_t>::ensureExtraCapacity(this_00,1);
      XVar1 = this_00->fCurCount;
      this_00->fElemList[XVar1] = targetStr;
      this_00->fCurCount = XVar1 + 1;
      return targetStr;
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

XMLCh* XMLStringTokenizer::nextToken() {

    if (fOffset >= fStringLen) {
        return 0;
    }

    bool tokFound = false;
    XMLSize_t startIndex = fOffset;
    XMLSize_t endIndex = fOffset;

    for (; endIndex < fStringLen; endIndex++) {

        if (isDelimeter(fString[endIndex])) {

			if (tokFound) {
                break;
            }

			startIndex++;
			continue;
        }

        tokFound = true;
    }

    fOffset = endIndex;

    if (tokFound) {

        XMLCh* tokStr = (XMLCh*) fMemoryManager->allocate
        (
            (endIndex - startIndex + 1) * sizeof(XMLCh)
        );//new XMLCh[(endIndex - startIndex) + 1];

        XMLString::subString(tokStr, fString, startIndex, endIndex, fMemoryManager);
        fTokens->addElement(tokStr);

        return tokStr;
	}

    return 0;
}